

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

void Wlc_NtkCreateMemoryConstr
               (Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Vec_Int_t *vMemObjsClean,Vec_Int_t *vReachReadCi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Wlc_Obj_t *pWVar5;
  Vec_Int_t *p_03;
  Wlc_Obj_t *pWVar6;
  Wlc_Obj_t *pWVar7;
  int iFanin1New;
  int iFanin0New;
  Vec_Int_t *vLocalCis;
  int iObjNew;
  int iObjCi;
  int k;
  int i;
  Wlc_Obj_t *pCond;
  Wlc_Obj_t *pObj;
  Wlc_Obj_t *pObjR;
  Vec_Int_t *vFanins;
  Vec_Int_t *vObjCis;
  Vec_Int_t *vReads;
  Vec_Int_t *vReachReadCi_local;
  Vec_Int_t *vMemObjsClean_local;
  Wlc_Ntk_t *p_local;
  Wlc_Ntk_t *pNew_local;
  
  p_00 = Wlc_NtkCollectOneType(p,vMemObjsClean,0x36,-1);
  p_01 = Wlc_NtkCollectOneType(p,vMemObjsClean,1,3);
  p_02 = Vec_IntAlloc(10);
  iObjCi = 0;
  do {
    iVar1 = Vec_IntSize(p_00);
    if (iVar1 <= iObjCi) {
      for (iObjNew = 0; iVar1 = Vec_IntSize(p_01), iObjNew < iVar1; iObjNew = iObjNew + 1) {
        iVar1 = Vec_IntEntry(p_01,iObjNew);
        pWVar5 = Wlc_NtkObj(p,iVar1);
        iVar1 = Wlc_ObjId(p,pWVar5);
        Wlc_ObjSetCopy(p,iVar1,-1);
      }
      Vec_IntFree(p_02);
      Vec_IntFree(p_00);
      Vec_IntFree(p_01);
      return;
    }
    iVar1 = Vec_IntEntry(p_00,iObjCi);
    pWVar5 = Wlc_NtkObj(p,iVar1);
    iVar1 = Wlc_ObjId(p,pWVar5);
    p_03 = Wlc_NtkExtractCisForThisRead(vReachReadCi,iVar1);
    for (iObjNew = 0; iVar1 = Vec_IntSize(p_01), iObjNew < iVar1; iObjNew = iObjNew + 1) {
      iVar1 = Vec_IntEntry(p_01,iObjNew);
      pWVar6 = Wlc_NtkObj(p,iVar1);
      iVar1 = Wlc_ObjId(p,pWVar6);
      Wlc_ObjSetCopy(p,iVar1,-1);
    }
    for (iObjNew = 0; iVar1 = Vec_IntSize(p_03), iObjNew + 1 < iVar1; iObjNew = iObjNew + 2) {
      iVar1 = Vec_IntEntry(p_03,iObjNew);
      iVar2 = Vec_IntEntry(p_03,iObjNew + 1);
      Wlc_ObjSetCopy(p,iVar1,iVar2);
    }
    Vec_IntFree(p_03);
    for (iObjNew = 0; iVar1 = Vec_IntSize(vMemObjsClean), iObjNew < iVar1; iObjNew = iObjNew + 1) {
      iVar1 = Vec_IntEntry(vMemObjsClean,iObjNew);
      pWVar6 = Wlc_NtkObj(p,iVar1);
      iVar1 = Wlc_ObjIsRead(pWVar6);
      if ((iVar1 == 0) && (iVar1 = Wlc_ObjIsCi(pWVar6), iVar1 == 0)) {
        iVar1 = Wlc_ObjId(p,pWVar6);
        Wlc_ObjSetCopy(p,iVar1,-1);
        iVar1 = Wlc_ObjIsWrite(pWVar6);
        if (iVar1 == 0) {
          iVar1 = Wlc_ObjIsMux(pWVar6);
          if (iVar1 == 0) {
            iVar1 = Wlc_ObjIsBuf(pWVar6);
            if (iVar1 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                            ,0x549,
                            "void Wlc_NtkCreateMemoryConstr(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            iVar1 = Wlc_ObjFaninId0(pWVar6);
            vLocalCis._0_4_ = Wlc_ObjCopy(p,iVar1);
            if ((int)vLocalCis != -1) goto LAB_003f465d;
          }
          else {
            iVar1 = Wlc_ObjFaninId1(pWVar6);
            iVar1 = Wlc_ObjCopy(p,iVar1);
            iVar2 = Wlc_ObjFaninId2(pWVar6);
            iVar2 = Wlc_ObjCopy(p,iVar2);
            if ((iVar1 != -1) && (iVar2 != -1)) {
              iVar3 = Wlc_ObjRange(pWVar5);
              pWVar7 = Wlc_NtkObj(pNew,iVar1);
              iVar4 = Wlc_ObjRange(pWVar7);
              if (iVar3 != iVar4) {
                __assert_fail("Wlc_ObjRange(pObjR) == Wlc_ObjRange(Wlc_NtkObj(pNew, iFanin0New))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                              ,0x53b,
                              "void Wlc_NtkCreateMemoryConstr(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              iVar3 = Wlc_ObjRange(pWVar5);
              pWVar7 = Wlc_NtkObj(pNew,iVar2);
              iVar4 = Wlc_ObjRange(pWVar7);
              if (iVar3 != iVar4) {
                __assert_fail("Wlc_ObjRange(pObjR) == Wlc_ObjRange(Wlc_NtkObj(pNew, iFanin1New))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                              ,0x53c,
                              "void Wlc_NtkCreateMemoryConstr(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              iVar3 = Wlc_ObjRange(pWVar5);
              vLocalCis._0_4_ = Wlc_ObjAlloc(pNew,8,0,iVar3 + -1,0);
              iVar3 = Wlc_ObjFaninId0(pWVar6);
              iVar3 = Wlc_ObjCopy(p,iVar3);
              Vec_IntFill(p_02,1,iVar3);
              Vec_IntPush(p_02,iVar1);
              Vec_IntPush(p_02,iVar2);
              pWVar7 = Wlc_NtkObj(pNew,(int)vLocalCis);
              Wlc_ObjAddFanins(pNew,pWVar7,p_02);
LAB_003f465d:
              iVar1 = Wlc_ObjId(p,pWVar6);
              Wlc_ObjSetCopy(p,iVar1,(int)vLocalCis);
            }
          }
        }
        else {
          iVar1 = Wlc_ObjFaninId0(pWVar6);
          iVar1 = Wlc_ObjCopy(p,iVar1);
          if (iVar1 != -1) {
            iVar1 = Wlc_ObjRange(pWVar5);
            pWVar7 = Wlc_ObjFanin2(p,pWVar6);
            iVar2 = Wlc_ObjRange(pWVar7);
            if (iVar1 == iVar2) {
              iVar1 = Wlc_ObjAlloc(pNew,0x1f,0,0,0);
              pWVar7 = Wlc_NtkObj(pNew,iVar1);
              iVar1 = Wlc_ObjFaninId1(pWVar5);
              iVar1 = Wlc_ObjCopy(p,iVar1);
              iVar2 = Wlc_ObjFaninId1(pWVar6);
              iVar2 = Wlc_ObjCopy(p,iVar2);
              Vec_IntFillTwo(p_02,2,iVar1,iVar2);
              Wlc_ObjAddFanins(pNew,pWVar7,p_02);
              iVar1 = Wlc_ObjRange(pWVar5);
              vLocalCis._0_4_ = Wlc_ObjAlloc(pNew,8,0,iVar1 + -1,0);
              iVar1 = Wlc_ObjId(pNew,pWVar7);
              Vec_IntFill(p_02,1,iVar1);
              iVar1 = Wlc_ObjFaninId2(pWVar6);
              iVar1 = Wlc_ObjCopy(p,iVar1);
              Vec_IntPush(p_02,iVar1);
              iVar1 = Wlc_ObjFaninId0(pWVar6);
              iVar1 = Wlc_ObjCopy(p,iVar1);
              Vec_IntPush(p_02,iVar1);
              pWVar7 = Wlc_NtkObj(pNew,(int)vLocalCis);
              Wlc_ObjAddFanins(pNew,pWVar7,p_02);
              goto LAB_003f465d;
            }
          }
        }
      }
    }
    iVar1 = Wlc_ObjFaninId0(pWVar5);
    iVar1 = Wlc_ObjCopy(p,iVar1);
    if (iVar1 == -1) {
      __assert_fail("iObjNew != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                    ,0x54e,
                    "void Wlc_NtkCreateMemoryConstr(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    Vec_IntFill(p_02,1,iVar1);
    iVar1 = Wlc_ObjId(p,pWVar5);
    iVar1 = Wlc_ObjCopy(p,iVar1);
    pWVar5 = Wlc_NtkObj(pNew,iVar1);
    if ((undefined1  [24])((undefined1  [24])*pWVar5 & (undefined1  [24])0x3f) !=
        (undefined1  [24])0x7) {
      __assert_fail("Wlc_NtkObj(pNew, iObjNew)->Type == WLC_OBJ_BUF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                    ,0x552,
                    "void Wlc_NtkCreateMemoryConstr(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    pWVar5 = Wlc_NtkObj(pNew,iVar1);
    Wlc_ObjAddFanins(pNew,pWVar5,p_02);
    iObjCi = iObjCi + 1;
  } while( true );
}

Assistant:

void Wlc_NtkCreateMemoryConstr( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Vec_Int_t * vMemObjsClean, Vec_Int_t * vReachReadCi )
{
    Vec_Int_t * vReads  = Wlc_NtkCollectOneType( p, vMemObjsClean, WLC_OBJ_READ, -1 );
    Vec_Int_t * vObjCis = Wlc_NtkCollectOneType( p, vMemObjsClean, WLC_OBJ_PI, WLC_OBJ_FO );
    Vec_Int_t * vFanins = Vec_IntAlloc( 10 );
    Wlc_Obj_t * pObjR, * pObj, * pCond; 
    int i, k, iObjCi, iObjNew = -1;
    // go through read ports
    Wlc_NtkForEachObjVec( vReads, p, pObjR, i )
    {
        // ABC_READ  ( .mem_in(mem_fi1), .addr(raddr), .data(read1) ) ;
        // ABC_WRITE ( .mem_in(mem_fo1), .addr(waddr), .data(data), .mem_out(mem_fi1) ) ;
        // initialize CI related to the read port
        Vec_Int_t * vLocalCis = Wlc_NtkExtractCisForThisRead( vReachReadCi, Wlc_ObjId(p, pObjR) );
        Wlc_NtkForEachObjVec( vObjCis, p, pObj, k )
            Wlc_ObjSetCopy( p, Wlc_ObjId(p, pObj), -1 );
        Vec_IntForEachEntryDouble( vLocalCis, iObjCi, iObjNew, k )
            Wlc_ObjSetCopy( p, iObjCi, iObjNew );
        Vec_IntFree( vLocalCis );
        // implement the nodes
        Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, k )
        {
            if ( Wlc_ObjIsRead(pObj) || Wlc_ObjIsCi(pObj) )
                continue;
            Wlc_ObjSetCopy( p, Wlc_ObjId(p, pObj), -1 );
            if ( Wlc_ObjIsWrite(pObj) )
            {
                if ( Wlc_ObjCopy(p, Wlc_ObjFaninId0(pObj)) == -1 )
                    continue;
                if ( Wlc_ObjRange(pObjR) != Wlc_ObjRange(Wlc_ObjFanin2(p, pObj)) )
                    continue;
                // create equality
                pCond = Wlc_NtkObj( pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_EQU, 0, 0, 0) );
                Vec_IntFillTwo( vFanins, 2, Wlc_ObjCopy(p, Wlc_ObjFaninId1(pObjR)), Wlc_ObjCopy(p, Wlc_ObjFaninId1(pObj)) );
                //printf( "%d : ", Wlc_ObjId(p,pObj) ), Vec_IntPrint( vFanins );
                Wlc_ObjAddFanins( pNew, pCond, vFanins );
                // create MUX
                iObjNew = Wlc_ObjAlloc( pNew, WLC_OBJ_MUX, 0, Wlc_ObjRange(pObjR)-1, 0 );
                Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pCond) );
                Vec_IntPush( vFanins, Wlc_ObjCopy(p, Wlc_ObjFaninId2(pObj)) );
                Vec_IntPush( vFanins, Wlc_ObjCopy(p, Wlc_ObjFaninId0(pObj)) );
                Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjNew), vFanins );
            }
            else if ( Wlc_ObjIsMux(pObj) )
            {
                int iFanin0New = Wlc_ObjCopy(p, Wlc_ObjFaninId1(pObj));
                int iFanin1New = Wlc_ObjCopy(p, Wlc_ObjFaninId2(pObj));
                if ( iFanin0New == -1 || iFanin1New == -1 )
                    continue;
                //Wlc_NtkPrintNode( pNew, Wlc_NtkObj(pNew, iFanin0New) );
                assert( Wlc_ObjRange(pObjR) == Wlc_ObjRange(Wlc_NtkObj(pNew, iFanin0New)) );
                assert( Wlc_ObjRange(pObjR) == Wlc_ObjRange(Wlc_NtkObj(pNew, iFanin1New)) );
                iObjNew = Wlc_ObjAlloc( pNew, WLC_OBJ_MUX, 0, Wlc_ObjRange(pObjR)-1, 0 );
                Vec_IntFill( vFanins, 1, Wlc_ObjCopy(p, Wlc_ObjFaninId0(pObj)) );
                Vec_IntPush( vFanins, iFanin0New );
                Vec_IntPush( vFanins, iFanin1New );
                Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjNew), vFanins );
            }
            else if ( Wlc_ObjIsBuf(pObj) )
            {
                iObjNew = Wlc_ObjCopy( p, Wlc_ObjFaninId0(pObj) );
                if ( iObjNew == -1 )
                    continue;
            }
            else assert( 0 );
            Wlc_ObjSetCopy( p, Wlc_ObjId(p, pObj), iObjNew );
        }
        // extract fanin
        iObjNew = Wlc_ObjCopy( p, Wlc_ObjFaninId0(pObjR) );
        assert( iObjNew != -1 );
        Vec_IntFill( vFanins, 1, iObjNew );
        // add it as buffer fanin
        iObjNew = Wlc_ObjCopy( p, Wlc_ObjId(p, pObjR) );
        assert( Wlc_NtkObj(pNew, iObjNew)->Type == WLC_OBJ_BUF );
        Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjNew), vFanins );
    }
    Wlc_NtkForEachObjVec( vObjCis, p, pObj, k )
        Wlc_ObjSetCopy( p, Wlc_ObjId(p, pObj), -1 );
    Vec_IntFree( vFanins );
    Vec_IntFree( vReads );
    Vec_IntFree( vObjCis );
}